

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupTestCase.cpp
# Opt level: O2

void __thiscall SuiteGroupTests::TesthasGroup::~TesthasGroup(TesthasGroup *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(hasGroup)
{
  Group parent(5, 100);

  Group child(1, 10);
  child.setField(1, "1");
  child.setField(2, "2");
  parent.addGroup(child);

  CHECK(parent.hasGroup(child));

  Group missingChild(2, 10);
  CHECK(!parent.hasGroup(missingChild));
}